

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

QVariant * __thiscall
QGraphicsScene::inputMethodQuery
          (QVariant *__return_storage_ptr__,QGraphicsScene *this,InputMethodQuery query)

{
  undefined8 uVar1;
  long lVar2;
  qreal qVar3;
  QRectF QVar4;
  GraphicsItemFlags GVar5;
  int iVar6;
  QPoint QVar7;
  long lVar8;
  undefined8 *puVar9;
  QRect *pQVar10;
  long in_FS_OFFSET;
  byte bVar11;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  QRect QVar12;
  QPointF QVar13;
  QTransform matrix;
  QRectF local_b8;
  QVariant local_98;
  QRect local_78 [5];
  long local_28;
  
  bVar11 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if (*(QGraphicsItem **)(lVar2 + 0x188) != (QGraphicsItem *)0x0) {
    GVar5 = QGraphicsItem::flags(*(QGraphicsItem **)(lVar2 + 0x188));
    if (((uint)GVar5.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
               super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 0xc & 1) != 0) {
      puVar9 = &DAT_006f3c60;
      pQVar10 = local_78;
      for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
        uVar1 = *puVar9;
        pQVar10->x1 = (Representation)(int)uVar1;
        pQVar10->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
        pQVar10 = (QRect *)&pQVar10[-(ulong)bVar11].x2;
      }
      QGraphicsItem::sceneTransform((QTransform *)local_78,*(QGraphicsItem **)(lVar2 + 0x188));
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0x14) = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).field_0x18 = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).field_0x1c = 0xaaaaaaaa;
      *(undefined4 *)&(__return_storage_ptr__->d).data = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 4) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 8) = 0xaaaaaaaa;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).data + 0xc) = 0xaaaaaaaa;
      (**(code **)(**(long **)(lVar2 + 0x188) + 0x100))
                (__return_storage_ptr__,*(long **)(lVar2 + 0x188),query);
      iVar6 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar6 == 0x14) {
        ::QVariant::toRectF();
        QTransform::mapRect(&local_b8);
        QVar4.yp = local_b8.yp;
        QVar4.xp = local_b8.xp;
        QVar4.w = local_b8.w;
        QVar4.h = local_b8.h;
        ::QVariant::QVariant(&local_98,QVar4);
      }
      else {
        iVar6 = ::QVariant::typeId(__return_storage_ptr__);
        if (iVar6 == 0x1a) {
          ::QVariant::toPointF();
          qVar3 = (qreal)QTransform::map((QPointF *)local_78);
          QVar13.yp._4_4_ = in_XMM1_Db;
          QVar13.yp._0_4_ = in_XMM1_Da;
          QVar13.xp = qVar3;
          ::QVariant::QVariant(&local_98,QVar13);
        }
        else {
          iVar6 = ::QVariant::typeId(__return_storage_ptr__);
          if (iVar6 == 0x13) {
            ::QVariant::toRect();
            QVar12 = (QRect)QTransform::mapRect(local_78);
            ::QVariant::QVariant(&local_98,QVar12);
          }
          else {
            iVar6 = ::QVariant::typeId(__return_storage_ptr__);
            if (iVar6 != 0x19) goto LAB_00605d5a;
            ::QVariant::toPoint();
            QVar7 = (QPoint)QTransform::map((QPoint *)local_78);
            ::QVariant::QVariant(&local_98,QVar7);
          }
        }
      }
      ::QVariant::operator=(__return_storage_ptr__,&local_98);
      ::QVariant::~QVariant(&local_98);
      goto LAB_00605d5a;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00605d5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsScene::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsScene);
    if (!d->focusItem || !(d->focusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod))
        return QVariant();
    const QTransform matrix = d->focusItem->sceneTransform();
    QVariant value = d->focusItem->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = matrix.mapRect(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = matrix.map(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = matrix.mapRect(value.toRect());
    else if (value.userType() == QMetaType::QPoint)
        value = matrix.map(value.toPoint());
    return value;
}